

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulsummaryxreftocsv.cpp
# Opt level: O1

void gulsummaryxreftocsv::doit(void)

{
  size_t sVar1;
  gulsummaryxref q;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  puts("\"coverage_id\", \"summary_id\", \"summaryset_id\"");
  sVar1 = fread(&local_24,0xc,1,_stdin);
  if (sVar1 != 0) {
    do {
      printf("%d, %d, %d\n",(ulong)local_24,(ulong)local_20,(ulong)local_1c);
      sVar1 = fread(&local_24,0xc,1,_stdin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void doit()
	{

		printf("\"coverage_id\", \"summary_id\", \"summaryset_id\"\n");

		gulsummaryxref q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d, %d, %d\n", q.coverage_id, q.summary_id, q.summaryset_id);
			i = fread(&q, sizeof(q), 1, stdin);
		}
	}